

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O2

void GetCombinedEntropyUnrefined_C
               (uint32_t *X,uint32_t *Y,int length,VP8LBitEntropy *bit_entropy,VP8LStreaks *stats)

{
  uint uVar1;
  long lVar2;
  float fVar3;
  uint32_t xy_prev;
  int i_prev;
  
  _xy_prev = (ulong)(*Y + *X);
  stats->counts[0] = 0;
  stats->counts[1] = 0;
  stats->streaks[0] = (int  [2])0x0;
  stats->streaks[1] = (int  [2])0x0;
  bit_entropy->entropy = 0.0;
  bit_entropy->sum = 0;
  bit_entropy->nonzeros = 0;
  bit_entropy->max_val = 0;
  bit_entropy->nonzero_code = 0xffffffff;
  for (lVar2 = 1; lVar2 < length; lVar2 = lVar2 + 1) {
    if (Y[lVar2] + X[lVar2] != xy_prev) {
      GetEntropyUnrefinedHelper(Y[lVar2] + X[lVar2],(int)lVar2,&xy_prev,&i_prev,bit_entropy,stats);
    }
  }
  GetEntropyUnrefinedHelper(0,(int)lVar2,&xy_prev,&i_prev,bit_entropy,stats);
  uVar1 = bit_entropy->sum;
  if ((ulong)uVar1 < 0x100) {
    fVar3 = kSLog2Table[uVar1];
  }
  else {
    fVar3 = (*VP8LFastSLog2Slow)(uVar1);
  }
  bit_entropy->entropy = (double)fVar3 + bit_entropy->entropy;
  return;
}

Assistant:

static void GetCombinedEntropyUnrefined_C(const uint32_t X[],
                                          const uint32_t Y[],
                                          int length,
                                          VP8LBitEntropy* const bit_entropy,
                                          VP8LStreaks* const stats) {
  int i = 1;
  int i_prev = 0;
  uint32_t xy_prev = X[0] + Y[0];

  memset(stats, 0, sizeof(*stats));
  VP8LBitEntropyInit(bit_entropy);

  for (i = 1; i < length; ++i) {
    const uint32_t xy = X[i] + Y[i];
    if (xy != xy_prev) {
      GetEntropyUnrefinedHelper(xy, i, &xy_prev, &i_prev, bit_entropy, stats);
    }
  }
  GetEntropyUnrefinedHelper(0, i, &xy_prev, &i_prev, bit_entropy, stats);

  bit_entropy->entropy += VP8LFastSLog2(bit_entropy->sum);
}